

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFileSpecObjectHelper.cc
# Opt level: O2

QPDFObjectHandle __thiscall
QPDFFileSpecObjectHelper::getEmbeddedFileStreams(QPDFFileSpecObjectHelper *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  QPDFObjectHandle QVar1;
  allocator<char> local_39;
  undefined1 local_38 [48];
  
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_38,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 8));
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_38 + 0x10),"/EF",&local_39);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)local_38);
  std::__cxx11::string::~string((string *)(local_38 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFFileSpecObjectHelper::getEmbeddedFileStreams()
{
    return oh().getKey("/EF");
}